

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O2

void __thiscall xray_re::xr_mesh_builder::remove_duplicate_faces(xr_mesh_builder *this)

{
  pointer pbVar1;
  bool bVar2;
  uint uVar3;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  __first;
  b_face *face;
  pointer this_00;
  
  generate_vertex_faces(this);
  this_00 = (this->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_faces).
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_00 == pbVar1) {
      __first = std::
                __remove_if<__gnu_cxx::__normal_iterator<xray_re::xr_mesh_builder::b_face*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>,__gnu_cxx::__ops::_Iter_pred<bad_face_pred>>
                          ((this->m_faces).
                           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->m_faces).
                           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      erase(&this->m_faces,(const_iterator)__first._M_current,
            (this->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_finish);
      return;
    }
    uVar3 = (this->m_vertex_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[(this_00->field_0).field_0.v[0]];
    while (uVar3 != 0xffffffff) {
      face = (this->m_faces).
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar3;
      if (this_00 < face) {
        bVar2 = b_face::is_duplicate(this_00,face);
        if (bVar2) {
          (this_00->field_1).field_1.surf_idx = 0xffffffff;
          break;
        }
      }
      uVar3 = b_face::next_face_idx(face,(ulong)(this_00->field_0).field_0.v[0]);
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void xr_mesh_builder::remove_duplicate_faces()
{
	generate_vertex_faces();
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end(); it != end; ++it) {
		for (uint_fast32_t next = m_vertex_faces[it->v0]; next != BAD_IDX;) {
			b_face* face = &m_faces[next];
			if (face > &*it && it->is_duplicate(*face)) {
				it->surf_idx = BAD_IDX;
				goto skip;
			}
			next = face->next_face_idx(it->v0);
		}
skip:;
	}
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), bad_face_pred()), m_faces.end());
}